

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::InstanceHelper::InstanceHelper
          (InstanceHelper *this,Context *context,Type wsiType,VkAllocationCallbacks *pAllocator)

{
  RefData<vk::VkInstance_s_*> data;
  PlatformInterface *pPVar1;
  VkInstance_s **ppVVar2;
  Move<vk::VkInstance_s_*> local_58;
  RefData<vk::VkInstance_s_*> local_40;
  VkAllocationCallbacks *local_28;
  VkAllocationCallbacks *pAllocator_local;
  Context *pCStack_18;
  Type wsiType_local;
  Context *context_local;
  InstanceHelper *this_local;
  
  local_28 = pAllocator;
  pAllocator_local._4_4_ = wsiType;
  pCStack_18 = context;
  context_local = (Context *)this;
  pPVar1 = Context::getPlatformInterface(context);
  ::vk::enumerateInstanceExtensionProperties(&this->supportedExtensions,pPVar1,(char *)0x0);
  pPVar1 = Context::getPlatformInterface(pCStack_18);
  createInstanceWithWsi(&local_58,pPVar1,&this->supportedExtensions,pAllocator_local._4_4_,local_28)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_58);
  data.deleter.m_destroyInstance = local_40.deleter.m_destroyInstance;
  data.object = local_40.object;
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique(&this->instance,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_58);
  pPVar1 = Context::getPlatformInterface(pCStack_18);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->instance).super_RefBase<vk::VkInstance_s_*>);
  ::vk::InstanceDriver::InstanceDriver(&this->vki,pPVar1,*ppVVar2);
  return;
}

Assistant:

InstanceHelper (Context& context, Type wsiType, const VkAllocationCallbacks* pAllocator = DE_NULL)
		: supportedExtensions	(enumerateInstanceExtensionProperties(context.getPlatformInterface(),
																	  DE_NULL))
		, instance				(createInstanceWithWsi(context.getPlatformInterface(),
													   supportedExtensions,
													   wsiType,
													   pAllocator))
		, vki					(context.getPlatformInterface(), *instance)
	{}